

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

void mime_subparts_unbind(void *ptr)

{
  curl_mimepart *part;
  curl_mime *mime;
  
  if ((ptr != (void *)0x0) &&
     (part = *(curl_mimepart **)((long)ptr + 8), part != (curl_mimepart *)0x0)) {
    part->freefunc = (curl_free_callback)0x0;
    cleanup_part_content(part);
    *(undefined8 *)((long)ptr + 8) = 0;
  }
  return;
}

Assistant:

static void mime_subparts_unbind(void *ptr)
{
  curl_mime *mime = (curl_mime *) ptr;

  if(mime && mime->parent) {
    mime->parent->freefunc = NULL;  /* Be sure we won't be called again. */
    cleanup_part_content(mime->parent);  /* Avoid dangling pointer in part. */
    mime->parent = NULL;
  }
}